

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

bool __thiscall spdlog::logger::should_flush_(logger *this,log_msg *msg)

{
  long in_RSI;
  long in_RDI;
  __int_type_conflict flush_level;
  memory_order __b;
  undefined1 local_39;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  local_39 = false;
  if (*(int *)(in_RDI + 0x44) <= *(int *)(in_RSI + 0x10)) {
    local_39 = *(int *)(in_RSI + 0x10) != 6;
  }
  return local_39;
}

Assistant:

SPDLOG_INLINE bool logger::should_flush_(const details::log_msg &msg) {
    auto flush_level = flush_level_.load(std::memory_order_relaxed);
    return (msg.level >= flush_level) && (msg.level != level::off);
}